

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O1

void IoTHubTransport_MQTT_Common_Unsubscribe(TRANSPORT_LL_HANDLE handle)

{
  ushort uVar1;
  uint16_t packetId;
  int iVar2;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  char *unsubscribe [1];
  char *local_10;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"IoTHubTransport_MQTT_Common_Unsubscribe",0xdfc,1,
                 "Invalid argument to unsubscribe (NULL).");
      return;
    }
  }
  else {
    local_10 = STRING_c_str(*(STRING_HANDLE *)((long)handle + 8));
    uVar1 = (ushort)*(undefined4 *)((long)handle + 0x80);
    packetId = 1;
    if (uVar1 < 0xfffe) {
      packetId = uVar1 + 1;
    }
    *(uint16_t *)((long)handle + 0x80) = packetId;
    iVar2 = mqtt_client_unsubscribe
                      (*(MQTT_CLIENT_HANDLE *)((long)handle + 0x70),packetId,&local_10,1);
    if (iVar2 != 0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"IoTHubTransport_MQTT_Common_Unsubscribe",0xdf4,1,
                   "Failure calling mqtt_client_unsubscribe");
      }
    }
    STRING_delete(*(STRING_HANDLE *)((long)handle + 8));
    *(undefined8 *)((long)handle + 8) = 0;
    *(byte *)((long)handle + 0x30) = *(byte *)((long)handle + 0x30) & 0xfb;
  }
  return;
}

Assistant:

void IoTHubTransport_MQTT_Common_Unsubscribe(TRANSPORT_LL_HANDLE handle)
{
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data != NULL)
    {
        const char* unsubscribe[1];
        unsubscribe[0] = STRING_c_str(transport_data->topic_MqttMessage);
        if (mqtt_client_unsubscribe(transport_data->mqttClient, getNextPacketId(transport_data), unsubscribe, 1) != 0)
        {
            LogError("Failure calling mqtt_client_unsubscribe");
        }
        STRING_delete(transport_data->topic_MqttMessage);
        transport_data->topic_MqttMessage = NULL;
        transport_data->topics_ToSubscribe &= ~SUBSCRIBE_TELEMETRY_TOPIC;
    }
    else
    {
        LogError("Invalid argument to unsubscribe (NULL).");
    }
}